

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::
SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>::
emplaceRealloc<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>
          (SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>
           *this,pointer pos,
          unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *args)

{
  ulong uVar1;
  long lVar2;
  move_iterator<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_*>
  __first;
  unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *__result;
  pointer puVar3;
  ulong uVar4;
  move_iterator<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_*>
  __last;
  
  if (*(long *)(this + 8) != 0xfffffffffffffff) {
    uVar4 = *(long *)(this + 8) + 1;
    uVar1 = *(ulong *)(this + 0x10);
    if (uVar4 < uVar1 * 2) {
      uVar4 = uVar1 * 2;
    }
    if (0xfffffffffffffff - uVar1 < uVar1) {
      uVar4 = 0xfffffffffffffff;
    }
    lVar2 = *(long *)this;
    __result = (unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *)
               operator_new(uVar4 * 8);
    puVar3 = (pointer)((long)__result + ((long)pos - lVar2));
    *(Lexer **)((long)__result + ((long)pos - lVar2)) =
         (args->_M_t).
         super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>.
         _M_t.
         super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
         .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl;
    (args->_M_t).
    super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>._M_t.
    super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>.
    super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl = (Lexer *)0x0;
    __first._M_current =
         *(unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> **)this;
    __last._M_current = __first._M_current + *(long *)(this + 8);
    if (__last._M_current == pos) {
      std::__uninitialized_copy<false>::
      __uninit_copy<std::move_iterator<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>*>,std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>*>
                (__first,__last,__result);
    }
    else {
      std::__uninitialized_copy<false>::
      __uninit_copy<std::move_iterator<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>*>,std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>*>
                (__first,(move_iterator<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_*>
                          )pos,__result);
      __last._M_current =
           (unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *)
           (*(long *)(this + 8) * 8 + *(long *)this);
      std::__uninitialized_copy<false>::
      __uninit_copy<std::move_iterator<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>*>,std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>*>
                ((move_iterator<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_*>
                  )pos,__last,puVar3 + 1);
    }
    SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
    ::cleanup((SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
               *)this,(EVP_PKEY_CTX *)__last._M_current);
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    *(ulong *)(this + 0x10) = uVar4;
    *(unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> **)this =
         __result;
    return puVar3;
  }
  detail::throwLengthError();
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}